

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

wchar_t cmd_get_effect_from_list
                  (command_conflict *cmd,char *arg,int *choice,char *prompt,effect *effect,
                  wchar_t count,_Bool allow_random)

{
  wchar_t wVar1;
  wchar_t wVar2;
  effect *effect_00;
  cmd_arg_data_conflict data;
  wchar_t selection;
  wchar_t local_3c;
  wchar_t *local_38;
  
  local_38 = choice;
  if ((count == L'\xffffffff') && (count = L'\0', effect_00 = effect, effect != (effect *)0x0)) {
    do {
      count = count + L'\x01';
      effect_00 = effect_next(effect_00);
    } while (effect_00 != (effect *)0x0);
  }
  wVar1 = cmd_get_arg_choice(cmd,arg,&local_3c);
  if ((wVar1 != L'\0') ||
     ((local_3c != L'\xfffffffe' || !allow_random && (local_3c < L'\0' || count <= local_3c)))) {
    local_3c = get_effect_from_list(prompt,effect,count,allow_random);
  }
  wVar1 = local_3c;
  data.point.y = 0;
  data.number = local_3c;
  if ((data.string == (char *)0xfffffffe && allow_random) ||
     (wVar2 = L'\xfffffffd', local_3c < count && L'\xffffffff' < local_3c)) {
    cmd_set_arg(cmd,arg,arg_CHOICE,data);
    *local_38 = wVar1;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int cmd_get_effect_from_list(struct command *cmd, const char *arg, int *choice,
	const char *prompt, struct effect *effect, int count,
	bool allow_random)
{
	int selection;

	if (count == -1) {
		struct effect *cursor = effect;

		count = 0;
		while (cursor) {
			++count;
			cursor = effect_next(cursor);
		}
	}

	if (cmd_get_arg_choice(cmd, arg, &selection) != CMD_OK ||
			((selection != -2 || !allow_random) &&
			(selection < 0 || selection >= count))) {
		/* It isn't in the command or is invalid; prompt. */
		selection = get_effect_from_list(prompt, effect, count,
			allow_random);
	}
	if ((selection == -2 && allow_random) ||
			(selection >= 0 && selection < count)) {
		/* Record the selection in the command. */
		cmd_set_arg_choice(cmd, arg, selection);
		*choice = selection;
		return CMD_OK;
	}
	return CMD_ARG_ABORTED;
}